

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O3

void __thiscall OpenMD::DumpWriter::writeFrame(DumpWriter *this,ostream *os)

{
  int ioIndex;
  StuntDouble *pSVar1;
  Molecule *pMVar2;
  Molecule *pMVar3;
  StuntDouble *sd;
  pointer ppSVar4;
  _func_int **pp_Var5;
  ostream *poVar6;
  RigidBody *rb;
  DumpWriter *this_00;
  int siteIndex;
  MoleculeIterator mi;
  string local_68;
  ostream *local_48;
  MoleculeIterator local_40;
  Molecule *local_38;
  
  local_40._M_node = (_Base_ptr)0x0;
  this_00 = (DumpWriter *)os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"  <Snapshot>\n",0xd);
  writeFrameProperties(this_00,os,this->info_->sman_->currentSnapshot_);
  local_48 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"    <StuntDoubles>\n",0x13);
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_40);
  if (pMVar3 != (Molecule *)0x0) {
    do {
      ppSVar4 = (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar4 !=
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar1 = *ppSVar4;
        while (pSVar1 != (StuntDouble *)0x0) {
          ppSVar4 = ppSVar4 + 1;
          prepareDumpLine_abi_cxx11_(&local_68,this,pSVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if (ppSVar4 ==
              (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pSVar1 = *ppSVar4;
        }
      }
      pMVar3 = SimInfo::nextMolecule(this->info_,&local_40);
    } while (pMVar3 != (Molecule *)0x0);
  }
  poVar6 = local_48;
  std::__ostream_insert<char,std::char_traits<char>>(local_48,"    </StuntDoubles>\n",0x14);
  if (this->doSiteData_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    <SiteData>\n",0xf);
    pMVar3 = SimInfo::beginMolecule(this->info_,&local_40);
    while (pMVar3 != (Molecule *)0x0) {
      ppSVar4 = (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pMVar2 = local_38;
      if (ppSVar4 !=
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar1 = *ppSVar4;
        while (local_38 = pMVar3, pSVar1 != (StuntDouble *)0x0) {
          ioIndex = pSVar1->globalIntegrableObjectIndex_;
          prepareSiteLine_abi_cxx11_(&local_68,this,pSVar1,ioIndex,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,local_68._M_dataplus._M_p,local_68._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if (((pSVar1->objType_ == otRigidBody) &&
              (pp_Var5 = (_func_int **)pSVar1[2].mass_,
              pp_Var5 != pSVar1[2].properties_._vptr_PropertyMap)) &&
             (sd = (StuntDouble *)*pp_Var5, sd != (StuntDouble *)0x0)) {
            siteIndex = 0;
            do {
              pp_Var5 = pp_Var5 + 1;
              prepareSiteLine_abi_cxx11_(&local_68,this,sd,ioIndex,siteIndex);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              if (pp_Var5 == pSVar1[2].properties_._vptr_PropertyMap) break;
              siteIndex = siteIndex + 1;
              sd = (StuntDouble *)*pp_Var5;
            } while (sd != (StuntDouble *)0x0);
          }
          ppSVar4 = ppSVar4 + 1;
          poVar6 = local_48;
          pMVar2 = local_38;
          if (ppSVar4 ==
              (local_38->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pMVar3 = local_38;
          pSVar1 = *ppSVar4;
        }
      }
      local_38 = pMVar2;
      pMVar3 = SimInfo::nextMolecule(this->info_,&local_40);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    </SiteData>\n",0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  </Snapshot>\n",0xe);
  std::ostream::flush();
  (**(code **)(**(long **)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0xe8) + 0x30))();
  return;
}

Assistant:

void DumpWriter::writeFrame(std::ostream& os) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ii;
    RigidBody::AtomIterator ai;

#ifndef IS_MPI
    os << "  <Snapshot>\n";

    writeFrameProperties(os, info_->getSnapshotManager()->getCurrentSnapshot());

    os << "    <StuntDoubles>\n";
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        os << prepareDumpLine(sd);
      }
    }
    os << "    </StuntDoubles>\n";

    if (doSiteData_) {
      os << "    <SiteData>\n";
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          os << prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              os << prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }
      os << "    </SiteData>\n";
    }
    os << "  </Snapshot>\n";

    os.flush();
    os.rdbuf()->pubsync();
#else

    const int primaryNode = 0;
    int worldRank;
    int nProc;

    MPI_Comm_size(MPI_COMM_WORLD, &nProc);
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == primaryNode) {
      os << "  <Snapshot>\n";
      writeFrameProperties(os,
                           info_->getSnapshotManager()->getCurrentSnapshot());
      os << "    <StuntDoubles>\n";
    }

    // every node prepares the dump lines for integrable objects belong to
    // itself
    std::string buffer;
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        buffer += prepareDumpLine(sd);
      }
    }

    if (worldRank == primaryNode) {
      os << buffer;

      for (int i = 1; i < nProc; ++i) {
        // tell processor i to start sending us data:

        MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // receive the length of the string buffer that was
        // prepared by processor i:
        int recvLength;
        MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                 &istatus);

        // create a buffer to receive the data
        char* recvBuffer = new char[recvLength];
        if (recvBuffer == NULL) {
        } else {
          // receive the data:
          MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                   MPI_COMM_WORLD, &istatus);
          // send it to the file:
          os << recvBuffer;
          // get rid of the receive buffer:
          delete[] recvBuffer;
        }
      }
    } else {
      int sendBufferLength = buffer.size() + 1;
      int myturn           = 0;
      for (int i = 1; i < nProc; ++i) {
        // wait for the primary node to call our number:
        MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        if (myturn == worldRank) {
          // send the length of our buffer:

          MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                   MPI_COMM_WORLD);

          // send our buffer:
          MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                   primaryNode, 0, MPI_COMM_WORLD);
        }
      }
    }

    if (worldRank == primaryNode) { os << "    </StuntDoubles>\n"; }

    if (doSiteData_) {
      if (worldRank == primaryNode) { os << "    <SiteData>\n"; }
      buffer.clear();
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          buffer += prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              buffer += prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }

      if (worldRank == primaryNode) {
        os << buffer;

        for (int i = 1; i < nProc; ++i) {
          // tell processor i to start sending us data:
          MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

          // receive the length of the string buffer that was
          // prepared by processor i:
          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                   &istatus);

          // create a buffer to receive the data
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            // receive the data:
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                     MPI_COMM_WORLD, &istatus);
            // send it to the file:
            os << recvBuffer;
            // get rid of the receive buffer:
            delete[] recvBuffer;
          }
        }
      } else {
        int sendBufferLength = buffer.size() + 1;
        int myturn           = 0;
        for (int i = 1; i < nProc; ++i) {
          // wait for the primary node to call our number:
          MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
          if (myturn == worldRank) {
            // send the length of our buffer:
            MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                     MPI_COMM_WORLD);
            // send our buffer:
            MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                     primaryNode, 0, MPI_COMM_WORLD);
          }
        }
      }

      if (worldRank == primaryNode) { os << "    </SiteData>\n"; }
    }

    if (worldRank == primaryNode) {
      os << "  </Snapshot>\n";
      os.flush();
      os.rdbuf()->pubsync();
    }

#endif  // is_mpi
  }